

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage_module.h
# Opt level: O2

longlong __thiscall
shift_window_transformer::StageModule<float>::parameterCount(StageModule<float> *this)

{
  pointer ppSVar1;
  longlong lVar2;
  long lVar3;
  int i;
  ulong uVar4;
  
  lVar2 = Linear<float>::parameterCount(&(this->patch_partition).layer);
  uVar4 = 0;
  while( true ) {
    ppSVar1 = (this->layers).
              super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->layers).
                      super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar4)
    break;
    lVar3 = (**(code **)(*(long *)ppSVar1[uVar4] + 8))();
    lVar2 = lVar2 + lVar3;
    uVar4 = uVar4 + 1;
  }
  return lVar2;
}

Assistant:

long long parameterCount() {
            long long ret = patch_partition.parameterCount();
            for (int i = 0; i < layers.size(); ++i) {
                ret += layers[i]->parameterCount();
            }
            return ret;
        }